

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O1

duplicate_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::duplicate_param,boost::runtime::init_error>::
operator<<(duplicate_param *__return_storage_ptr__,
          specific_param_error<boost::runtime::duplicate_param,boost::runtime::init_error> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(val->_M_dataplus)._M_p,val->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::string::_M_append((char *)(this + 0x18),(ulong)local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  *(undefined ***)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
    super_init_error.super_param_error = &PTR__param_error_001cbb58;
  uVar1 = *(undefined4 *)(this + 0xc);
  uVar2 = *(undefined4 *)(this + 0x10);
  uVar3 = *(undefined4 *)(this + 0x14);
  *(undefined4 *)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
    super_init_error.super_param_error.param_name.m_begin = *(undefined4 *)(this + 8);
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
           super_init_error.super_param_error.param_name.m_begin + 4) = uVar1;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
    super_init_error.super_param_error.param_name.m_end = uVar2;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
           super_init_error.super_param_error.param_name.m_end + 4) = uVar3;
  (__return_storage_ptr__->
  super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
  super_init_error.super_param_error.msg._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>
                 ).super_init_error.super_param_error.msg.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(__return_storage_ptr__->
              super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>
              ).super_init_error.super_param_error.msg,*(long *)(this + 0x18),
             *(long *)(this + 0x20) + *(long *)(this + 0x18));
  *(undefined ***)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>).
    super_init_error.super_param_error = &PTR__param_error_001cc1d8;
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }